

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

SelectionVectorHelper * __thiscall
duckdb::ReservoirSample::GetReplacementIndexesFast
          (SelectionVectorHelper *__return_storage_ptr__,ReservoirSample *this,
          idx_t sample_chunk_offset,idx_t chunk_length)

{
  uint32_t size;
  idx_t iVar1;
  long lVar2;
  reference pvVar3;
  ulong count;
  idx_t i;
  size_type __n;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  SelectionVector chunk_sel;
  vector<unsigned_int,_true> random_sel_indexes;
  vector<unsigned_int,_true> random_indexes_chunk;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  replacement_indexes;
  SelectionVector local_c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  SelectionVector local_80;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  auVar5._8_4_ = (int)(chunk_length >> 0x20);
  auVar5._0_8_ = chunk_length;
  auVar5._12_4_ = 0x45300000;
  iVar1 = GetTuplesSeen(this);
  lVar2 = iVar1 + chunk_length;
  auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar6._0_8_ = lVar2;
  auVar6._12_4_ = 0x45300000;
  iVar1 = this->sample_count;
  auVar7._8_4_ = (int)(iVar1 >> 0x20);
  auVar7._0_8_ = iVar1;
  auVar7._12_4_ = 0x45300000;
  dVar4 = round(((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0)) *
                (((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(uint32_t)chunk_length) - 4503599627370496.0)) /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0))));
  (__return_storage_ptr__->sel).sel_vector = (sel_t *)0x0;
  (__return_storage_ptr__->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (__return_storage_ptr__->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  size = (uint32_t)(long)dVar4;
  if (size == 0) {
    SelectionVector::SelectionVector((SelectionVector *)&local_68,0);
    SelectionVector::operator=(&__return_storage_ptr__->sel,(SelectionVector *)&local_68);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_before_begin);
    __return_storage_ptr__->size = 0;
  }
  else {
    count = (long)dVar4 & 0xffffffff;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    SelectionVector::SelectionVector(&local_c8,count);
    GetRandomizedVector((vector<unsigned_int,_true> *)&local_98,this,(uint32_t)chunk_length,size);
    GetRandomizedVector((vector<unsigned_int,_true> *)&local_b0,this,(uint32_t)this->sel_size,size);
    for (__n = 0; count != __n; __n = __n + 1) {
      pvVar3 = vector<unsigned_int,_true>::get<true>((vector<unsigned_int,_true> *)&local_98,__n);
      local_c8.sel_vector[__n] = *pvVar3;
      pvVar3 = vector<unsigned_int,_true>::get<true>((vector<unsigned_int,_true> *)&local_b0,__n);
      (this->sel).sel_vector[*pvVar3] = (int)sample_chunk_offset + (int)__n;
    }
    SelectionVector::SelectionVector(&local_80,&local_c8);
    SelectionVector::operator=(&__return_storage_ptr__->sel,&local_80);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __return_storage_ptr__->size = size;
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b0);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c8.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionVectorHelper ReservoirSample::GetReplacementIndexesFast(idx_t sample_chunk_offset, idx_t chunk_length) {

	// how much weight to the other tuples have compared to the ones in this chunk?
	auto weight_tuples_other = static_cast<double>(chunk_length) / static_cast<double>(GetTuplesSeen() + chunk_length);
	auto num_to_pop = static_cast<uint32_t>(round(weight_tuples_other * static_cast<double>(sample_count)));
	D_ASSERT(num_to_pop <= sample_count);
	D_ASSERT(num_to_pop <= sel_size);
	SelectionVectorHelper ret;

	if (num_to_pop == 0) {
		ret.sel = SelectionVector(num_to_pop);
		ret.size = 0;
		return ret;
	}
	std::unordered_map<idx_t, idx_t> replacement_indexes;
	SelectionVector chunk_sel(num_to_pop);

	auto random_indexes_chunk = GetRandomizedVector(static_cast<uint32_t>(chunk_length), num_to_pop);
	auto random_sel_indexes = GetRandomizedVector(static_cast<uint32_t>(sel_size), num_to_pop);
	for (idx_t i = 0; i < num_to_pop; i++) {
		// update the selection vector for the reservoir sample
		chunk_sel.set_index(i, random_indexes_chunk[i]);
		// sel is not guaratneed to be random, so we update the indexes according to our
		// random sel indexes.
		sel.set_index(random_sel_indexes[i], sample_chunk_offset + i);
	}

	D_ASSERT(sel_size == sample_count);

	ret.sel = SelectionVector(chunk_sel);
	ret.size = num_to_pop;
	return ret;
}